

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

Scene * __thiscall CS248::DynamicScene::Scene::get_static_scene(Scene *this)

{
  bool bVar1;
  int iVar2;
  reference ppSVar3;
  undefined4 extraout_var;
  reference ppSVar4;
  undefined4 extraout_var_00;
  Scene *pSVar5;
  vector<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
  *in_RDI;
  SceneLight *light;
  iterator __end2_1;
  iterator __begin2_1;
  set<CS248::DynamicScene::SceneLight_*,_std::less<CS248::DynamicScene::SceneLight_*>,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  *__range2_1;
  SceneObject *staticObject;
  SceneObject *obj;
  iterator __end2;
  iterator __begin2;
  set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  *__range2;
  vector<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
  staticLights;
  vector<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
  staticObjects;
  set<CS248::DynamicScene::SceneLight_*,_std::less<CS248::DynamicScene::SceneLight_*>,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  *in_stack_ffffffffffffff48;
  _Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*> *in_stack_ffffffffffffff50;
  vector<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
  *in_stack_ffffffffffffff68;
  Scene *in_stack_ffffffffffffff70;
  _Self local_88;
  _Self local_80;
  pointer *local_78;
  value_type *local_60;
  SceneObject *local_58;
  _Self local_50;
  _Self local_48;
  pointer *local_40;
  vector<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
  *this_00;
  
  std::vector<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
  ::vector((vector<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
            *)0x202209);
  std::vector<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>::
  vector((vector<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
          *)0x202216);
  local_40 = &in_RDI[6].
              super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_48._M_node =
       (_Base_ptr)
       std::
       set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
       ::begin((set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
                *)in_stack_ffffffffffffff48);
  local_50._M_node =
       (_Base_ptr)
       std::
       set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
       ::end((set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
              *)in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = std::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    ppSVar3 = std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*>::operator*
                        (in_stack_ffffffffffffff50);
    local_58 = *ppSVar3;
    iVar2 = (*local_58->_vptr_SceneObject[7])();
    local_60 = (value_type *)CONCAT44(extraout_var,iVar2);
    if (local_60 != (value_type *)0x0) {
      std::
      vector<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
      ::push_back((vector<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
                   *)in_RDI,local_60);
    }
    std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*>::operator++
              (in_stack_ffffffffffffff50);
  }
  local_78 = &in_RDI[8].
              super__Vector_base<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_80._M_node =
       (_Base_ptr)
       std::
       set<CS248::DynamicScene::SceneLight_*,_std::less<CS248::DynamicScene::SceneLight_*>,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
       ::begin(in_stack_ffffffffffffff48);
  local_88._M_node =
       (_Base_ptr)
       std::
       set<CS248::DynamicScene::SceneLight_*,_std::less<CS248::DynamicScene::SceneLight_*>,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
       ::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = std::operator!=(&local_80,&local_88);
    if (!bVar1) break;
    ppSVar4 = std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneLight_*>::operator*
                        ((_Rb_tree_const_iterator<CS248::DynamicScene::SceneLight_*> *)0x202319);
    in_stack_ffffffffffffff70 = (Scene *)*ppSVar4;
    iVar2 = (*(code *)*(in_stack_ffffffffffffff70->objects).
                       super__Vector_base<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
                       ._M_impl.super__Vector_impl_data._M_start)();
    this_00 = (vector<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
               *)CONCAT44(extraout_var_00,iVar2);
    in_stack_ffffffffffffff68 = this_00;
    std::vector<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>
    ::push_back(this_00,(value_type *)in_stack_ffffffffffffff48);
    std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneLight_*>::operator++
              ((_Rb_tree_const_iterator<CS248::DynamicScene::SceneLight_*> *)this_00);
  }
  pSVar5 = (Scene *)operator_new(0x30);
  StaticScene::Scene::Scene
            (in_stack_ffffffffffffff70,
             (vector<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
              *)in_stack_ffffffffffffff68,in_RDI);
  std::vector<CS248::StaticScene::SceneLight_*,_std::allocator<CS248::StaticScene::SceneLight_*>_>::
  ~vector(in_RDI);
  std::vector<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
  ::~vector((vector<CS248::StaticScene::SceneObject_*,_std::allocator<CS248::StaticScene::SceneObject_*>_>
             *)in_RDI);
  return pSVar5;
}

Assistant:

StaticScene::Scene *Scene::get_static_scene() {
  std::vector<StaticScene::SceneObject *> staticObjects;
  std::vector<StaticScene::SceneLight *> staticLights;

  for (SceneObject *obj : objects) {
    auto staticObject = obj->get_static_object();
    if (staticObject != nullptr) staticObjects.push_back(staticObject);
  }
  for (SceneLight *light : lights) {
    staticLights.push_back(light->get_static_light());
  }

  return new StaticScene::Scene(staticObjects, staticLights);
}